

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CopyMessageTest_ArenaEnabledCopyConstructor_Test::
~CopyMessageTest_ArenaEnabledCopyConstructor_Test
          (CopyMessageTest_ArenaEnabledCopyConstructor_Test *this)

{
  CopyMessageTest_ArenaEnabledCopyConstructor_Test *this_local;
  
  ~CopyMessageTest_ArenaEnabledCopyConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructor) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  Arena arena;
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena, message1);
  TestUtil::ExpectAllFieldsSet(*message2);
}